

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

SharedData * __thiscall
Clasp::MinimizeBuilder::createShared
          (MinimizeBuilder *this,SharedContext *ctx,SumVec *adjust,CmpWeight *cmp)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  SharedData *this_00;
  reference rhs;
  reference pMVar4;
  LevelWeight *in_RCX;
  pod_vector<long,_std::allocator<long>_> *in_RDX;
  MLit *in_RSI;
  pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *in_RDI;
  LevelWeight *w;
  WeightLiteral x;
  uint32 i;
  weight_t wIdx;
  uint32 last;
  SharedData *ret;
  uint32 nLits;
  LevelWeight *in_stack_ffffffffffffff58;
  SharedContext *in_stack_ffffffffffffff60;
  MLit *in_stack_ffffffffffffff68;
  CmpWeight in_stack_ffffffffffffff70;
  MLit *lhs;
  LevelWeight local_70;
  size_type local_68;
  Literal local_64;
  pair<Clasp::Literal,_int> local_60;
  const_reference local_58;
  pair<Clasp::Literal,_int> local_4c;
  size_type local_44;
  size_type sVar5;
  MinimizeMode in_stack_ffffffffffffffc4;
  size_type n;
  SumVec *in_stack_ffffffffffffffc8;
  SharedMinimizeData *in_stack_ffffffffffffffd0;
  SharedData *pSVar6;
  
  sVar2 = bk_lib::
          pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
          size(in_RDI);
  this_00 = (SharedData *)operator_new((ulong)(sVar2 + 1) * 8 + 0x68);
  SharedMinimizeData::SharedMinimizeData
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  pSVar6 = this_00;
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  begin(in_RDI);
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  end(in_RDI);
  std::stable_sort<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::CmpWeight>
            (in_stack_ffffffffffffff68,(MLit *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff70);
  n = 0;
  sVar5 = 0;
  local_44 = 0;
  do {
    if (local_44 == sVar2) {
      local_64 = lit_true();
      local_68 = bk_lib::
                 pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                 ::size(&pSVar6->weights);
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_int,_true>
                (&local_60,&local_64,(int *)&local_68);
      std::pair<Clasp::Literal,_int>::operator=
                ((pair<Clasp::Literal,_int> *)
                 (&(((SharedData *)(pSVar6[1].up_ + -1))->adjust_).ebo_.buf + sVar2),&local_60);
      if (*in_RCX != (LevelWeight)0x0) {
        sVar3 = bk_lib::pod_vector<long,_std::allocator<long>_>::size(in_RDX);
        SharedMinimizeData::LevelWeight::LevelWeight(&local_70,sVar3 - 1,0);
        bk_lib::
        pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
        ::push_back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                     *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      SharedMinimizeData::resetBounds((SharedMinimizeData *)CONCAT44(n,sVar5));
      return pSVar6;
    }
    rhs = bk_lib::
          pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
          operator[](in_RDI,local_44);
    pMVar4 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::operator[](in_RDI,local_44);
    std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_int_&,_true>
              (&local_4c,&rhs->lit,&pMVar4->weight);
    lhs = in_RSI;
    Literal::var(&local_4c.first);
    SharedContext::setFrozen
              (in_stack_ffffffffffffff60,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
    std::pair<Clasp::Literal,_int>::operator=
              ((pair<Clasp::Literal,_int> *)
               (&(((SharedData *)(pSVar6[1].up_ + -1))->adjust_).ebo_.buf + local_44),&local_4c);
    if (*in_RCX != (LevelWeight)0x0) {
      if (local_44 == 0) {
LAB_001b0e1c:
        n = local_44;
        sVar5 = bk_lib::
                pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                ::size(&pSVar6->weights);
        local_58 = bk_lib::
                   pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                   ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                                 *)*in_RCX,local_4c.second);
        while (bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::push_back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                            *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58),
              *(int *)local_58 < 0) {
          local_58 = local_58 + 1;
        }
      }
      else {
        in_stack_ffffffffffffff58 = in_RCX;
        in_stack_ffffffffffffff60 =
             (SharedContext *)
             bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::operator[](in_RDI,n);
        bk_lib::
        pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
        operator[](in_RDI,local_44);
        bVar1 = CmpWeight::operator()((CmpWeight *)this_00,lhs,rhs);
        if (bVar1) goto LAB_001b0e1c;
      }
      *(size_type *)((long)pSVar6[1].up_ + (ulong)local_44 * 8 + -0xc) = sVar5;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

MinimizeBuilder::SharedData* MinimizeBuilder::createShared(SharedContext& ctx, const SumVec& adjust, const CmpWeight& cmp) {
	const uint32 nLits = static_cast<uint32>(lits_.size());
	SharedData*  ret   = new (::operator new(sizeof(SharedData) + ((nLits + 1)*sizeof(WeightLiteral)))) SharedData(adjust);
	// sort literals by decreasing weight
	std::stable_sort(lits_.begin(), lits_.end(), cmp);
	uint32   last = 0;
	weight_t wIdx = 0;
	for (uint32 i = 0; i != nLits; ++i) {
		WeightLiteral x(lits_[i].lit, lits_[i].weight);
		ctx.setFrozen(x.first.var(), true);
		ret->lits[i] = x;
		if (!cmp.weights) { continue; }
		if (!i || cmp(lits_[last], lits_[i])) {
			last = i;
			wIdx = (weight_t)ret->weights.size();
			for (const SharedData::LevelWeight* w = &(*cmp.weights)[x.second];; ++w) {
				ret->weights.push_back(*w);
				if (!w->next) { break; }
			}
		}
		ret->lits[i].second = wIdx;
	}
	ret->lits[nLits] = WeightLiteral(lit_true(), (weight_t)ret->weights.size());
	if (cmp.weights) {
		ret->weights.push_back(SharedData::LevelWeight((uint32)adjust.size()-1, 0));
	}
	ret->resetBounds();
	return ret;
}